

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanoftp.c
# Opt level: O2

int xmlNanoFTPCwd(void *ctx,char *directory)

{
  int iVar1;
  size_t sVar2;
  ssize_t sVar3;
  int iVar4;
  char buf [400];
  
  iVar4 = -1;
  if ((ctx != (void *)0x0) && (*(int *)((long)ctx + 0x44) != -1)) {
    if (directory == (char *)0x0) {
      iVar4 = 0;
    }
    else {
      snprintf(buf,400,"CWD %s\r\n");
      buf[399] = '\0';
      sVar2 = strlen(buf);
      sVar3 = send(*(int *)((long)ctx + 0x44),buf,(long)(int)sVar2,0);
      iVar4 = (int)sVar3;
      if (iVar4 < 0) {
        __xmlIOErr(9,0,"send failed");
      }
      else {
        iVar1 = xmlNanoFTPReadResponse(ctx);
        iVar4 = 0;
        if (iVar1 - 2U < 4) {
          iVar4 = *(int *)(&DAT_001ec794 + (ulong)(iVar1 - 2U) * 4);
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int
xmlNanoFTPCwd(void *ctx, const char *directory) {
    xmlNanoFTPCtxtPtr ctxt = (xmlNanoFTPCtxtPtr) ctx;
    char buf[400];
    int len;
    int res;

    if ((ctxt == NULL) || (ctxt->controlFd == INVALID_SOCKET)) return(-1);
    if (directory == NULL) return 0;

    /*
     * Expected response code for CWD:
     *
     * CWD
     *     250
     *     500, 501, 502, 421, 530, 550
     */
    snprintf(buf, sizeof(buf), "CWD %s\r\n", directory);
    buf[sizeof(buf) - 1] = 0;
    len = strlen(buf);
#ifdef DEBUG_FTP
    xmlGenericError(xmlGenericErrorContext, "%s", buf);
#endif
    res = send(ctxt->controlFd, SEND_ARG2_CAST buf, len, 0);
    if (res < 0) {
	__xmlIOErr(XML_FROM_FTP, 0, "send failed");
	return(res);
    }
    res = xmlNanoFTPGetResponse(ctxt);
    if (res == 4) {
	return(-1);
    }
    if (res == 2) return(1);
    if (res == 5) {
	return(0);
    }
    return(0);
}